

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.c
# Opt level: O0

int CClass::Lookup(char *name)

{
  bool bVar1;
  char *in_RDI;
  CClass *aclass;
  int nclass;
  CClass *local_20;
  
  local_20 = first;
  while( true ) {
    if (local_20 == (CClass *)0x0) {
      return -1;
    }
    bVar1 = RString::PrefixMatch(&local_20->name,in_RDI);
    if (bVar1) break;
    local_20 = local_20->next;
  }
  return local_20->index;
}

Assistant:

int CClass::Lookup (const char *name)
{
	int nclass;
	CClass *aclass;
	for (aclass = first; aclass; aclass = aclass->next)
		if (aclass->name.PrefixMatch(name))
			return aclass->index;

	return -1;
}